

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O0

off_t ngx_chain_coalesce_file(ngx_chain_t **in,off_t limit)

{
  ngx_buf_t **ppnVar1;
  ngx_buf_t **ppnVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  ngx_chain_t *local_48;
  ngx_chain_t *cl;
  ngx_fd_t fd;
  off_t fprev;
  off_t aligned;
  off_t size;
  off_t total;
  off_t limit_local;
  ngx_chain_t **in_local;
  
  size = 0;
  local_48 = *in;
  ppnVar1 = &local_48->buf;
  do {
    lVar3 = local_48->buf->file_last - local_48->buf->file_pos;
    if (limit - size < lVar3) {
      aligned = limit - size;
      uVar4 = (local_48->buf->file_pos + aligned + ngx_pagesize) - 1 &
              (ngx_pagesize - 1 ^ 0xffffffffffffffff);
      if ((long)uVar4 <= local_48->buf->file_last) {
        aligned = uVar4 - local_48->buf->file_pos;
      }
      size = aligned + size;
      break;
    }
    size = lVar3 + size;
    ppnVar2 = &local_48->buf;
    local_48 = local_48->next;
    bVar5 = false;
    if ((((local_48 != (ngx_chain_t *)0x0) &&
         (bVar5 = false, (*(ushort *)&local_48->buf->field_0x48 >> 4 & 1) != 0)) &&
        (bVar5 = false, size < limit)) &&
       (bVar5 = false, (*ppnVar1)->file->fd == local_48->buf->file->fd)) {
      bVar5 = (*ppnVar2)->file_pos + lVar3 == local_48->buf->file_pos;
    }
  } while (bVar5);
  *in = local_48;
  return size;
}

Assistant:

off_t
ngx_chain_coalesce_file(ngx_chain_t **in, off_t limit)
{
    off_t         total, size, aligned, fprev;
    ngx_fd_t      fd;
    ngx_chain_t  *cl;

    total = 0;

    cl = *in;
    fd = cl->buf->file->fd;

    do {
        size = cl->buf->file_last - cl->buf->file_pos;

        if (size > limit - total) {
            size = limit - total;

            aligned = (cl->buf->file_pos + size + ngx_pagesize - 1)
                       & ~((off_t) ngx_pagesize - 1);

            if (aligned <= cl->buf->file_last) {
                size = aligned - cl->buf->file_pos;
            }

            total += size;
            break;
        }

        total += size;
        fprev = cl->buf->file_pos + size;
        cl = cl->next;

    } while (cl
             && cl->buf->in_file
             && total < limit
             && fd == cl->buf->file->fd
             && fprev == cl->buf->file_pos);

    *in = cl;

    return total;
}